

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall
preprocessor_test_foreach_Test::preprocessor_test_foreach_Test(preprocessor_test_foreach_Test *this)

{
  preprocessor_test *in_RDI;
  
  preprocessor_test::preprocessor_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__preprocessor_test_foreach_Test_0018e280;
  return;
}

Assistant:

TEST_F(preprocessor_test, foreach)
{
#define PREPROCESSOR_TEST_FOR_EACH_STR_SIZE 0x04

	char for_each_str[PREPROCESSOR_TEST_FOR_EACH_STR_SIZE];

	memset(for_each_str, '\0', sizeof(char) * PREPROCESSOR_TEST_FOR_EACH_STR_SIZE);

#define PREPROCESSOR_TEST_FOR_EACH(expr) strncat(for_each_str, expr, PREPROCESSOR_TEST_FOR_EACH_STR_SIZE - 1);

	PREPROCESSOR_FOR_EACH(PREPROCESSOR_TEST_FOR_EACH, "a", "b", "c")

#undef PREPROCESSOR_TEST_FOR_EACH

#undef PREPROCESSOR_TEST_FOR_EACH_STR_SIZE

	EXPECT_STREQ(for_each_str, "abc");
}